

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O0

void __thiscall scheduler_tests::mockforward::test_method(mockforward *this)

{
  milliseconds delta_00;
  milliseconds delta_01;
  milliseconds delta_02;
  milliseconds delta_03;
  bool bVar1;
  seconds delta_seconds;
  rep rVar2;
  long in_FS_OFFSET;
  int delta;
  time_point now;
  thread scheduler_thread;
  size_t num_tasks;
  time_point last;
  time_point first;
  Function dummy;
  int counter;
  CScheduler scheduler;
  char *in_stack_fffffffffffffb98;
  lazy_ostream *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  function<void_()> *in_stack_fffffffffffffbb0;
  function<void_()> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  CScheduler *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  time_point *in_stack_fffffffffffffbd8;
  unit_test_log_t *this_00;
  time_point *in_stack_fffffffffffffbe0;
  CScheduler *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  const_string local_388 [2];
  lazy_ostream local_368;
  lazy_ostream local_2f4;
  undefined1 local_2e0 [16];
  lazy_ostream local_2a0;
  undefined1 local_288 [68];
  undefined4 local_244;
  undefined1 *local_238;
  undefined4 local_20c;
  undefined1 *local_1f8;
  lazy_ostream local_1e8;
  undefined1 local_1d0 [64];
  size_t local_190 [3];
  undefined4 local_174;
  undefined4 local_13c;
  undefined4 local_104;
  undefined4 *local_d0;
  undefined4 local_a4;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler((CScheduler *)in_stack_fffffffffffffb98);
  local_a4 = 0;
  local_d0 = &local_a4;
  std::function<void()>::function<scheduler_tests::mockforward::test_method()::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffba8,
             (anon_class_8_1_bc7188dc *)in_stack_fffffffffffffba0);
  std::function<void_()>::function(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_104 = 2;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98,(int *)0x9e1610);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffba0,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98);
  delta_00.__r._7_1_ = in_stack_fffffffffffffbff;
  delta_00.__r._0_7_ = in_stack_fffffffffffffbf8;
  CScheduler::scheduleFromNow
            (in_stack_fffffffffffffbc8,
             (Function *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),delta_00);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffb98);
  std::function<void_()>::function(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_13c = 5;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98,(int *)0x9e168c);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffba0,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98);
  delta_01.__r._7_1_ = in_stack_fffffffffffffbff;
  delta_01.__r._0_7_ = in_stack_fffffffffffffbf8;
  CScheduler::scheduleFromNow
            (in_stack_fffffffffffffbc8,
             (Function *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),delta_01);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffb98);
  std::function<void_()>::function(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_174 = 8;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98,(int *)0x9e1708);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffba0,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98);
  delta_02.__r._7_1_ = in_stack_fffffffffffffbff;
  delta_02.__r._0_7_ = in_stack_fffffffffffffbf8;
  CScheduler::scheduleFromNow
            (in_stack_fffffffffffffbc8,
             (Function *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),delta_02);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffb98);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffb98);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffb98);
  local_190[0] = CScheduler::getQueueInfo
                           (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                            in_stack_fffffffffffffbd8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffbd8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (size_t)in_stack_fffffffffffffbc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    delta_seconds.__r = (rep)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffba0,(char (*) [1])in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    local_1e8._vptr_lazy_ostream = (_func_int **)0x3;
    in_stack_fffffffffffffba8 = "3ul";
    in_stack_fffffffffffffba0 = &local_1e8;
    in_stack_fffffffffffffb98 = "num_tasks";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1d0,&local_1e8.m_empty,0xbe,1,2,local_190);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_1f8 = local_a0;
  std::thread::thread<scheduler_tests::mockforward::test_method()::__2,,void>
            ((thread *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
             (type *)in_stack_fffffffffffffbc8);
  local_20c = 5;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98,(int *)0x9e1919);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffba0,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb98);
  CScheduler::MockForward
            ((CScheduler *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
             delta_seconds);
  local_238 = local_a0;
  std::function<void()>::function<scheduler_tests::mockforward::test_method()::__1,void>
            ((function<void_()> *)in_stack_fffffffffffffba8,
             (anon_class_8_1_0c04475b *)in_stack_fffffffffffffba0);
  local_244 = 1;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb98,(int *)0x9e198e);
  delta_03.__r._7_1_ = in_stack_fffffffffffffbff;
  delta_03.__r._0_7_ = in_stack_fffffffffffffbf8;
  CScheduler::scheduleFromNow
            (in_stack_fffffffffffffbc8,
             (Function *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),delta_03);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffb98);
  std::thread::join();
  local_190[0] = CScheduler::getQueueInfo
                           (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                            in_stack_fffffffffffffbd8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffbd8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (size_t)in_stack_fffffffffffffbc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffba0,(char (*) [1])in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    local_2a0._vptr_lazy_ostream = (_func_int **)0x1;
    in_stack_fffffffffffffba8 = "1ul";
    in_stack_fffffffffffffba0 = &local_2a0;
    in_stack_fffffffffffffb98 = "num_tasks";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_288,&local_2a0.m_empty,0xcb,1,2,local_190);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffbd8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               (size_t)in_stack_fffffffffffffbc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffba0,(char (*) [1])in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    local_2f4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffffba8 = "2";
    in_stack_fffffffffffffba0 = &local_2f4;
    in_stack_fffffffffffffb98 = "counter";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_2e0,(undefined1 *)((long)&local_2f4._vptr_lazy_ostream + 4),0xce,1,2,&local_a4)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffb98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffba0,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffb98);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffba0);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffb98);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0)
               ,(size_t)in_stack_fffffffffffffbc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
    in_stack_fffffffffffffbd7 = 0x78 < (int)rVar2 && (int)rVar2 < 0xb4;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffba8,
               SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0));
    in_stack_fffffffffffffbc8 = (CScheduler *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffba0,(basic_cstring<const_char> *)in_stack_fffffffffffffb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffba8,
               (pointer)in_stack_fffffffffffffba0,(unsigned_long)in_stack_fffffffffffffb98);
    in_stack_fffffffffffffb98 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffcb8,&local_368,local_388,0xd4,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb98);
    in_stack_fffffffffffffbc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffbc7);
  std::thread::~thread((thread *)in_stack_fffffffffffffb98);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffb98);
  CScheduler::~CScheduler((CScheduler *)in_stack_fffffffffffffb98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(mockforward)
{
    CScheduler scheduler;

    int counter{0};
    CScheduler::Function dummy = [&counter]{counter++;};

    // schedule jobs for 2, 5 & 8 minutes into the future

    scheduler.scheduleFromNow(dummy, std::chrono::minutes{2});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{5});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{8});

    // check taskQueue
    std::chrono::steady_clock::time_point first, last;
    size_t num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 3ul);

    std::thread scheduler_thread([&]() { scheduler.serviceQueue(); });

    // bump the scheduler forward 5 minutes
    scheduler.MockForward(std::chrono::minutes{5});

    // ensure scheduler has chance to process all tasks queued for before 1 ms from now.
    scheduler.scheduleFromNow([&scheduler] { scheduler.stop(); }, std::chrono::milliseconds{1});
    scheduler_thread.join();

    // check that the queue only has one job remaining
    num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 1ul);

    // check that the dummy function actually ran
    BOOST_CHECK_EQUAL(counter, 2);

    // check that the time of the remaining job has been updated
    auto now = std::chrono::steady_clock::now();
    int delta = std::chrono::duration_cast<std::chrono::seconds>(first - now).count();
    // should be between 2 & 3 minutes from now
    BOOST_CHECK(delta > 2*60 && delta < 3*60);
}